

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*,int,char_const*>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
           *__return_storage_ptr__,v10 *this,char **args,int *args_1,char **args_2)

{
  longlong lVar1;
  char **args_local_2;
  int *args_local_1;
  char **args_local;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  size_t local_d0;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  size_t local_b0;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  longlong local_98;
  size_t local_90;
  
  local_98._0_4_ = *(undefined4 *)args;
  lVar1 = *(longlong *)args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_b0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_98;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_90;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_d0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}